

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O3

size_t __thiscall
wasm::SExpressionWasmBuilder::parseFunctionNames
          (SExpressionWasmBuilder *this,Element *s,Name *name,Name *exportName)

{
  bool bVar1;
  bool bVar2;
  List *pLVar3;
  Element *pEVar4;
  char *extraout_RDX;
  string_view *psVar5;
  ulong uVar6;
  uint i;
  ulong uVar7;
  IString str;
  string_view sVar8;
  
  pLVar3 = Element::list(s);
  uVar6 = 1;
  if (1 < (pLVar3->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).
          usedElements) {
    uVar7 = 1;
    while( true ) {
      i = (uint)uVar7;
      pEVar4 = Element::operator[](s,i);
      uVar6 = uVar7;
      if (pEVar4->isList_ != false) break;
      pEVar4 = Element::operator[](s,i);
      bVar2 = pEVar4->quoted_;
      bVar1 = pEVar4->isList_;
      pEVar4 = Element::operator[](s,i);
      if ((bVar1 != false) || (psVar5 = (string_view *)exportName, (bVar2 & 1U) == 0)) {
        if ((pEVar4->isList_ != false) || ((pEVar4->dollared_ & 1U) == 0)) break;
        pEVar4 = Element::operator[](s,i);
        psVar5 = (string_view *)name;
      }
      sVar8 = (string_view)Element::str(pEVar4);
      *psVar5 = sVar8;
      uVar6 = uVar7 + 1;
      pLVar3 = Element::list(s);
      if ((1 < uVar7) ||
         (uVar7 = uVar6,
         (pLVar3->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).usedElements
         <= uVar6)) break;
    }
  }
  pLVar3 = Element::list(s);
  if (uVar6 < (pLVar3->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).
              usedElements) {
    pEVar4 = Element::operator[](s,(uint)uVar6);
    if (pEVar4->isList_ == true) {
      pEVar4 = Element::operator[](s,(uint)uVar6);
      str.str._M_str = extraout_RDX;
      str.str._M_len = DAT_00da7ee0;
      bVar2 = elementStartsWith(pEVar4,str);
      if (bVar2) {
        pEVar4 = Element::operator[](pEVar4,1);
        sVar8 = (string_view)Element::str(pEVar4);
        (exportName->super_IString).str = sVar8;
        uVar6 = uVar6 + 1;
      }
    }
  }
  return uVar6;
}

Assistant:

size_t SExpressionWasmBuilder::parseFunctionNames(Element& s,
                                                  Name& name,
                                                  Name& exportName) {
  size_t i = 1;
  while (i < s.size() && i < 3 && s[i]->isStr()) {
    if (s[i]->quoted()) {
      // an export name
      exportName = s[i]->str();
      i++;
    } else if (s[i]->dollared()) {
      name = s[i]->str();
      i++;
    } else {
      break;
    }
  }
  if (i < s.size() && s[i]->isList()) {
    auto& inner = *s[i];
    if (elementStartsWith(inner, EXPORT)) {
      exportName = inner[1]->str();
      i++;
    }
  }
#if 0
  if (exportName.is() && !name.is()) {
    name = exportName; // useful for debugging
  }
#endif
  return i;
}